

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

string * makeTemp(string *__return_storage_ptr__,string *prefix)

{
  size_type sVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar1 = prefix->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1 + '\b');
  if (__return_storage_ptr__->_M_string_length != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (uVar5 < prefix->_M_string_length) {
        cVar3 = (prefix->_M_dataplus)._M_p[uVar5];
      }
      else {
        iVar4 = rand();
        cVar3 = (char)iVar4 +
                ((char)(uint)((ulong)((long)iVar4 * 0x4ec4ec4f) >> 0x23) - (char)(iVar4 >> 0x1f)) *
                -0x1a + 'a';
      }
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = cVar3;
      bVar2 = uVar6 < __return_storage_ptr__->_M_string_length;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeTemp(const std::string& prefix)
{
    std::string result(prefix.length() + 8, ' ');
    for (unsigned i = 0; i < result.length(); i++) {
        result[i] = i < prefix.length() ? prefix[i] : ('a' + (rand() % 26));
    }
    return result;
}